

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epd.c
# Opt level: O2

int EpdCmp(char *key1,char *key2)

{
  if ((*(double *)key1 == *(double *)key2) && (!NAN(*(double *)key1) && !NAN(*(double *)key2))) {
    return (int)(*(int *)(key1 + 8) != *(int *)(key2 + 8));
  }
  return 1;
}

Assistant:

int
EpdCmp(const char *key1, const char *key2)
{
  EpDouble *epd1 = (EpDouble *) key1;
  EpDouble *epd2 = (EpDouble *) key2;
  if (epd1->type.value != epd2->type.value ||
      epd1->exponent != epd2->exponent) {
    return(1);
  }
  return(0);
}